

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O1

void __thiscall
mp::
ConicConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::WarnOnMix(ConicConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            *this)

{
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  pointer pQVar1;
  pointer pQVar2;
  size_ty sVar3;
  bool bVar4;
  pointer pQVar5;
  string local_58;
  string local_38;
  
  bVar4 = HasAnyCones(this);
  if (bVar4) {
    this_00 = &((this->
                super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                ).mc_)->
               super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ;
    if (this_00->nQC2SOCPAttempted_ <= this_00->nQC2SOCPSucceeded_) {
      pQVar1 = (this_00->super_FlatModel<mp::DefaultFlatModelParams>).objs_.
               super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pQVar2 = (this_00->super_FlatModel<mp::DefaultFlatModelParams>).objs_.
               super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      bVar4 = pQVar1 != pQVar2;
      if (bVar4) {
        sVar3 = (pQVar1->qt_).folded_.
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                .m_size;
        while (sVar3 == 0) {
          pQVar5 = pQVar1 + 1;
          bVar4 = pQVar5 != pQVar2;
          if (pQVar5 == pQVar2) break;
          sVar3 = pQVar1[1].qt_.folded_.
                  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                  .m_data.
                  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                  .m_size;
          pQVar1 = pQVar5;
        }
      }
      if (!bVar4) {
        return;
      }
    }
    if (this_00->ifCvtSOCP2QC_ == false) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Mix QC+cones","");
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,
                 "Not all quadratic constraints could be recognized\nas quadratic cones; or, the objective is quadratic;\nadditionally, further conversion back to QC\nnot desired (option cvt:socp2qc) or other cone types present;\nsolver might not accept the model.\nTry to express all cones in standard forms,\nnot in the objective.\nSee mp.ampl.com/modeling-expressions.html#conic-optimization."
                 ,"");
      FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::AddWarning(this_00,&local_38,&local_58,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void WarnOnMix() {
    if ( !MC().ModelAPICanMixConicQCAndQC()) {  // cannot mix
      if ((HasAnyCones()                        // exp cones
           && (MC().NumQC2SOCPAttempted() > MC().NumQC2SOCPSucceeded()
               || MC().HasQPObjective()))       // and quadratics left in
           && !MC().IfConvertSOCP2QC()          // and not decided to convert
          ) {
        MC().AddWarning("Mix QC+cones",
                        "Not all quadratic constraints could "
                        "be recognized\nas quadratic cones; "
                        "or, the objective is quadratic;\n"
                        "additionally, further conversion back to QC\n"
                        "not desired (option cvt:socp2qc) or other cone types present;\n"
                        "solver might not accept the model.\n"
                        "Try to express all cones in standard forms,\n"
                        "not in the objective.\n"
                        "See mp.ampl.com/modeling-expressions.html#conic-optimization.");
      }
    }
  }